

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_common.h
# Opt level: O0

void literal_init(probability (*probs) [768],uint32_t lc,uint32_t lp)

{
  uint local_24;
  uint local_20;
  uint32_t j;
  uint32_t i;
  uint32_t coders;
  uint32_t lp_local;
  uint32_t lc_local;
  probability (*probs_local) [768];
  
  if (lc + lp < 5) {
    for (local_20 = 0; local_20 < (uint)(1 << ((char)lc + (char)lp & 0x1fU));
        local_20 = local_20 + 1) {
      for (local_24 = 0; local_24 < 0x300; local_24 = local_24 + 1) {
        probs[local_20][local_24] = 0x400;
      }
    }
    return;
  }
  __assert_fail("lc + lp <= LZMA_LCLP_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_common.h"
                ,0x84,"void literal_init(probability (*)[768], uint32_t, uint32_t)");
}

Assistant:

static inline void
literal_init(probability (*probs)[LITERAL_CODER_SIZE],
		uint32_t lc, uint32_t lp)
{
	assert(lc + lp <= LZMA_LCLP_MAX);

	const uint32_t coders = 1U << (lc + lp);

	for (uint32_t i = 0; i < coders; ++i)
		for (uint32_t j = 0; j < LITERAL_CODER_SIZE; ++j)
			bit_reset(probs[i][j]);

	return;
}